

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

QList<QAccessibleInterface_*> * __thiscall
QAccessibleTableCell::columnHeaderCells(QAccessibleTableCell *this)

{
  QHeaderView *pQVar1;
  QAbstractItemView *view_;
  QAbstractItemView *pQVar2;
  QAccessibleTableCell *in_RDI;
  QList<QAccessibleInterface_*> *headerCell;
  parameter_type in_stack_ffffffffffffffb8;
  QAccessibleTableCell *this_00;
  
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->super_QAccessibleTableCellInterface = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->super_QAccessibleActionInterface = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<QAccessibleInterface_*>::QList((QList<QAccessibleInterface_*> *)0x7f8e73);
  pQVar1 = horizontalHeader(this_00);
  if (pQVar1 != (QHeaderView *)0x0) {
    view_ = (QAbstractItemView *)operator_new(0x20);
    pQVar2 = ::QPointer::operator_cast_to_QAbstractItemView_
                       ((QPointer<QAbstractItemView> *)0x7f8ea0);
    QPersistentModelIndex::column();
    QAccessibleTableHeaderCell::QAccessibleTableHeaderCell
              ((QAccessibleTableHeaderCell *)this_00,view_,(int)((ulong)pQVar2 >> 0x20),
               (Orientation)pQVar2);
    QList<QAccessibleInterface_*>::append
              ((QList<QAccessibleInterface_*> *)0x7f8ed8,in_stack_ffffffffffffffb8);
  }
  return (QList<QAccessibleInterface_*> *)in_RDI;
}

Assistant:

QList<QAccessibleInterface*> QAccessibleTableCell::columnHeaderCells() const
{
    QList<QAccessibleInterface*> headerCell;
    if (horizontalHeader()) {
        // FIXME
        headerCell.append(new QAccessibleTableHeaderCell(view, m_index.column(), Qt::Horizontal));
    }
    return headerCell;
}